

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::vector<crnlib::mip_level_*>_>::vector
          (vector<crnlib::vector<crnlib::mip_level_*>_> *this,uint n,
          vector<crnlib::mip_level_*> *init)

{
  undefined8 in_RDX;
  uint n_00;
  uint in_ESI;
  vector<crnlib::vector<crnlib::mip_level_*>_> *in_RDI;
  bool in_stack_ffffffffffffffda;
  bool in_stack_ffffffffffffffdb;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  n_00 = (uint)((ulong)in_RDX >> 0x20);
  in_RDI->m_p = (vector<crnlib::mip_level_*> *)0x0;
  in_RDI->m_size = 0;
  in_RDI->m_capacity = 0;
  increase_capacity(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffdb,
                    in_stack_ffffffffffffffda);
  helpers::construct_array<crnlib::vector<crnlib::mip_level*>,crnlib::vector<crnlib::mip_level*>>
            ((vector<crnlib::mip_level_*> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),n_00,
             (vector<crnlib::mip_level_*> *)in_RDI);
  in_RDI->m_size = in_ESI;
  return;
}

Assistant:

inline vector(uint n, const T& init)
      : m_p(NULL),
        m_size(0),
        m_capacity(0) {
    increase_capacity(n, false);
    helpers::construct_array(m_p, n, init);
    m_size = n;
  }